

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkSetRefs(Wlc_Ntk_t *p)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  int local_20;
  int Fanin;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_NtkObjNumMax(p);
  Vec_IntFill(&p->vRefs,iVar1,0);
  for (Fanin = 1; iVar1 = Wlc_NtkObjNumMax(p), Fanin < iVar1; Fanin = Fanin + 1) {
    pWVar2 = Wlc_NtkObj(p,Fanin);
    for (local_20 = 0; iVar1 = Wlc_ObjFaninNum(pWVar2), local_20 < iVar1; local_20 = local_20 + 1) {
      iVar1 = Wlc_ObjFaninId(pWVar2,local_20);
      Vec_IntAddToEntry(&p->vRefs,iVar1,1);
    }
  }
  for (Fanin = 0; iVar1 = Wlc_NtkCoNum(p), Fanin < iVar1; Fanin = Fanin + 1) {
    pWVar2 = Wlc_NtkCo(p,Fanin);
    iVar1 = Wlc_ObjId(p,pWVar2);
    Vec_IntAddToEntry(&p->vRefs,iVar1,1);
  }
  return;
}

Assistant:

void Wlc_NtkSetRefs( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; int i, k, Fanin;
    Vec_IntFill( &p->vRefs, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
        Wlc_ObjForEachFanin( pObj, Fanin, k )
            Vec_IntAddToEntry( &p->vRefs, Fanin, 1 );
    Wlc_NtkForEachCo( p, pObj, i )
        Vec_IntAddToEntry( &p->vRefs, Wlc_ObjId(p, pObj), 1 );
}